

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::ChaiScript::internal_eval_file(ChaiScript *this,string *t_filename)

{
  bool bVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar3;
  file_not_found_error *anon_var_0;
  eval_error *t_ee;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> appendedpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *in_stack_00000218;
  undefined1 in_stack_00000cb7;
  string *in_stack_00000cb8;
  string *in_stack_00000cc0;
  ChaiScript *in_stack_00000cc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_88 [48];
  string local_58 [32];
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)((long)&in_RSI[7].field_2 + 8);
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff38);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_ffffffffffffff38);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffff40,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_ffffffffffffff38);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    exception::file_not_found_error::file_not_found_error
              ((file_not_found_error *)in_RSI,(string *)in_RDI);
    __cxa_throw(uVar2,&exception::file_not_found_error::typeinfo,
                exception::file_not_found_error::~file_not_found_error);
  }
  local_38 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_28);
  std::operator+(in_stack_ffffffffffffff68,in_RSI);
  load_file(in_stack_00000218);
  do_eval(in_stack_00000cc8,in_stack_00000cc0,in_stack_00000cb8,(bool)in_stack_00000cb7);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const Boxed_Value internal_eval_file(const std::string &t_filename) {
      for (const auto &path : m_use_paths)
      {
        try {
          const auto appendedpath = path + t_filename;
          return do_eval(load_file(appendedpath), appendedpath, true);
        } catch (const exception::file_not_found_error &) {
          // failed to load, try the next path
        } catch (const exception::eval_error &t_ee) {
          throw Boxed_Value(t_ee);
        }
      }

      // failed to load by any name
      throw exception::file_not_found_error(t_filename);

    }